

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_manyvector.c
# Opt level: O1

int check_ans(sunrealtype ans,N_Vector X,sunindextype param_3)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = 0;
  uVar3 = N_VGetSubvector_ManyVector(X,0);
  uVar4 = N_VGetSubvector_ManyVector(X,1);
  lVar5 = N_VGetLength(uVar3);
  lVar6 = N_VGetLength(uVar4);
  lVar7 = N_VGetSubvectorArrayPointer_ManyVector(X,0);
  lVar8 = N_VGetSubvectorArrayPointer_ManyVector(X,1);
  uVar1 = 1;
  if (lVar6 + lVar5 == param_3) {
    if (0 < lVar5) {
      iVar9 = 0;
      lVar10 = 0;
      do {
        iVar2 = SUNRCompare(*(undefined8 *)(lVar7 + lVar10 * 8),ans);
        iVar9 = iVar9 + iVar2;
        lVar10 = lVar10 + 1;
      } while (lVar5 != lVar10);
    }
    if (0 < lVar6) {
      lVar5 = 0;
      do {
        iVar2 = SUNRCompare(*(undefined8 *)(lVar8 + lVar5 * 8),ans);
        iVar9 = iVar9 + iVar2;
        lVar5 = lVar5 + 1;
      } while (lVar6 != lVar5);
    }
    uVar1 = (uint)(0 < iVar9);
  }
  return uVar1;
}

Assistant:

int check_ans(sunrealtype ans, N_Vector X, sunindextype local_length)
{
  int failure = 0;
  sunindextype i;
  N_Vector Xsub[2];
  sunrealtype *x0, *x1;
  sunindextype x0len, x1len;

  Xsub[0] = N_VGetSubvector_ManyVector(X, 0);
  Xsub[1] = N_VGetSubvector_ManyVector(X, 1);
  x0len   = N_VGetLength(Xsub[0]);
  x1len   = N_VGetLength(Xsub[1]);
  x0      = N_VGetSubvectorArrayPointer_ManyVector(X, 0);
  x1      = N_VGetSubvectorArrayPointer_ManyVector(X, 1);

  /* ensure that local_length = x0len + x1len */
  if (local_length != x0len + x1len) { return (1); }

  /* check vector data */
  for (i = 0; i < x0len; i++) { failure += SUNRCompare(x0[i], ans); }
  for (i = 0; i < x1len; i++) { failure += SUNRCompare(x1[i], ans); }

  return (failure > ZERO) ? (1) : (0);
}